

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.c
# Opt level: O1

int os_fd_linux_event_wait(os_fd_select *sel)

{
  uint32_t uVar1;
  uint64_t uVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  epoll_data_t *peVar6;
  ulong uVar7;
  
  uVar2 = sel->deadline;
  uVar4 = oonf_clock_getNow();
  uVar7 = uVar2 - uVar4;
  if (0x7ffffffe < uVar7) {
    uVar7 = 0x7fffffff;
  }
  iVar3 = epoll_wait(sel->_epoll_fd,(epoll_event *)sel,0x10,(int)uVar7);
  sel->_event_count = iVar3;
  if (((&log_global_mask)[_oonf_os_fd_subsystem.logging] & 1) != 0) {
    oonf_log(1,(ulong)_oonf_os_fd_subsystem.logging,"src/base/os_linux/os_fd_linux.c",0x70,0,0,
             "epoll_wait(maxdelay = %lu): %d",uVar7,iVar3);
  }
  iVar3 = sel->_event_count;
  if (0 < iVar3) {
    peVar6 = &sel->_events[0].data;
    lVar5 = 0;
    do {
      uVar1 = ((epoll_event *)((long)peVar6 + -4))->events;
      *(uint32_t *)(peVar6->u64 + 8) = uVar1;
      if (((&log_global_mask)[_oonf_os_fd_subsystem.logging] & 1) != 0) {
        oonf_log(1,(ulong)_oonf_os_fd_subsystem.logging,"src/base/os_linux/os_fd_linux.c",0x76,0,0,
                 "event %d: %x",lVar5,uVar1);
      }
      lVar5 = lVar5 + 1;
      iVar3 = sel->_event_count;
      peVar6 = (epoll_data_t *)((long)peVar6 + 0xc);
    } while (lVar5 < iVar3);
  }
  return iVar3;
}

Assistant:

int
os_fd_linux_event_wait(struct os_fd_select *sel) {
  struct os_fd *sock;
  uint64_t maxdelay;
  int i;

  maxdelay = oonf_clock_get_relative(sel->deadline);
  if (maxdelay > INT32_MAX) {
    maxdelay = INT32_MAX;
  }

  sel->_event_count = epoll_wait(sel->_epoll_fd, sel->_events, ARRAYSIZE(sel->_events), maxdelay);

  OONF_DEBUG(LOG_OS_SOCKET, "epoll_wait(maxdelay = %" PRIu64 "): %d", maxdelay, sel->_event_count);

  for (i = 0; i < sel->_event_count; i++) {
    sock = os_fd_event_get(sel, i);
    sock->received_events = sel->_events[i].events;

    OONF_DEBUG(LOG_OS_SOCKET, "event %d: %x", i, sock->received_events);
  }
  return sel->_event_count;
}